

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O3

void armci_init_domains(MPI_Comm comm)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  char *__s1;
  int *piVar6;
  size_t sVar7;
  ulong uVar8;
  char *__s;
  int iVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int size;
  int rank;
  char name [256];
  int local_160;
  int local_15c;
  ulong local_158;
  int local_14c;
  char *local_148;
  MPI_Comm local_140;
  undefined1 local_138 [264];
  long lVar13;
  
  iVar3 = MPI_Comm_rank(comm,&local_15c);
  if (iVar3 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x22,"void armci_init_domains(MPI_Comm)");
  }
  iVar3 = MPI_Comm_size(comm,&local_160);
  if (iVar3 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x24,"void armci_init_domains(MPI_Comm)");
  }
  lVar10 = (long)local_160;
  __s1 = (char *)malloc(lVar10 << 8);
  piVar6 = (int *)malloc(lVar10 << 2);
  MPI_Get_processor_name(local_138,&local_14c);
  iVar3 = MPI_Allgather(local_138,0x100,&ompi_mpi_char,__s1,0x100,&ompi_mpi_char,comm);
  if (iVar3 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x2d,"void armci_init_domains(MPI_Comm)");
  }
  *piVar6 = 1;
  iVar3 = 1;
  if (1 < local_160) {
    iVar3 = local_160 + -1;
    local_158 = 0;
    iVar5 = 1;
    local_148 = __s1;
    local_140 = comm;
    do {
      __s = __s1 + 0x100;
      sVar7 = strlen(__s);
      iVar9 = (int)sVar7;
      iVar4 = strncmp(__s1,__s,(long)iVar9);
      lVar10 = (long)(int)local_158;
      if (iVar4 == 0) {
        iVar5 = iVar5 + 1;
      }
      else {
        local_158 = (ulong)((int)local_158 + 1);
        piVar6[lVar10 + 1] = 0;
        lVar10 = lVar10 + 1;
        iVar5 = 1;
      }
      piVar6[lVar10] = iVar5;
      iVar3 = iVar3 + -1;
      __s1 = __s;
    } while (iVar3 != 0);
    iVar3 = *piVar6;
    __s1 = local_148;
    comm = local_140;
    local_14c = iVar9;
    if (0 < (int)local_158) {
      bVar1 = true;
      uVar8 = 1;
      do {
        if (piVar6[uVar8] != iVar3) {
          bVar1 = false;
        }
        uVar8 = uVar8 + 1;
      } while ((int)local_158 + 1 != uVar8);
      if (!bVar1) {
        iVar3 = 1;
        goto LAB_00159f60;
      }
    }
  }
  local_15c = local_15c / iVar3;
LAB_00159f60:
  _number_of_procs_per_node = iVar3;
  _my_node_id = local_15c;
  free(__s1);
  free(piVar6);
  iVar5 = MPI_Barrier(comm);
  iVar3 = _number_of_procs_per_node;
  if (iVar5 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x56,"void armci_init_domains(MPI_Comm)");
  }
  lVar10 = (long)_number_of_procs_per_node;
  if (1 < lVar10) {
    piVar6 = (int *)malloc(lVar10 * 4);
    auVar2 = _DAT_001b27f0;
    iVar5 = _my_node_id * iVar3;
    lVar10 = lVar10 + -1;
    auVar11._8_4_ = (int)lVar10;
    auVar11._0_8_ = lVar10;
    auVar11._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar11 = auVar11 ^ _DAT_001b27f0;
    auVar12 = _DAT_001b2820;
    do {
      auVar14 = auVar12 ^ auVar2;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        *(int *)((long)piVar6 + lVar10) = iVar5;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        *(int *)((long)piVar6 + lVar10 + 4) = iVar5 + 1;
      }
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
      lVar10 = lVar10 + 8;
      iVar5 = iVar5 + 2;
    } while ((ulong)(iVar3 + 1U >> 1) << 3 != lVar10);
    comex_group_create(iVar3,piVar6,0,&ARMCI_Node_group);
    free(piVar6);
  }
  return;
}

Assistant:

void armci_init_domains(MPI_Comm comm)
{
  int i, status;
  char name[MPI_MAX_PROCESSOR_NAME];
  char *namebuf, *buf_ptr, *prev_ptr;
  int namelen, rank, size, nprocs;
  int *nodeid, *nodesize;
  int ncnt;

  status = MPI_Comm_rank(comm, &rank);
  assert(MPI_SUCCESS == status);
  status = MPI_Comm_size(comm, &size);
  assert(MPI_SUCCESS == status);

  /* determine number of processors per node. First find node name */
  namebuf = (char*)malloc(MPI_MAX_PROCESSOR_NAME*size*sizeof(char));
  nodeid = (int*)malloc(size*sizeof(int));
  nodesize = (int*)malloc(size*sizeof(int));
  MPI_Get_processor_name(name, &namelen);
  status = MPI_Allgather(name,MPI_MAX_PROCESSOR_NAME,MPI_CHAR,namebuf,
      MPI_MAX_PROCESSOR_NAME,MPI_CHAR,comm);
  assert(MPI_SUCCESS == status);

  /* Bin all processors with the same node name */
  ncnt = 0;
  nodeid[0] = ncnt;
  nodesize[0] = 1;
  prev_ptr = namebuf;
  buf_ptr = namebuf+MPI_MAX_PROCESSOR_NAME;
  for (i=1; i<size; i++) {
    namelen = strlen(buf_ptr);
    if (strncmp(prev_ptr,buf_ptr,namelen) != 0) {
      ncnt++;
      nodesize[ncnt]=0;
    }
    nodeid[i] = ncnt;
    nodesize[ncnt]++;
    prev_ptr += MPI_MAX_PROCESSOR_NAME;
    buf_ptr += MPI_MAX_PROCESSOR_NAME;
  }
  ncnt++;
  /* check to see if all nodes have the same number of processors */
  status = 1;
  nprocs = nodesize[0];
  for (i=1; i<ncnt; i++) {
    if (nodesize[i] != nprocs) status = 0;
  }
  /* uneven number of processors per node so bail out and assume each
   * processor is a node */
  if (!status) {
    _number_of_procs_per_node = 1;
    _my_node_id = rank;
  } else {
    /* Same number of processors for all nodes so set domain variables */
    _number_of_procs_per_node = nprocs;
    _my_node_id = rank/_number_of_procs_per_node;
  }

  free(namebuf);
  free(nodeid);
  free(nodesize);
  status = MPI_Barrier(comm);
  assert(MPI_SUCCESS == status);
  /* Create a comex group on the node */
  if (_number_of_procs_per_node > 1) {
    int *nodelist = (int*)malloc(_number_of_procs_per_node*sizeof(int));
    for (i=0; i<_number_of_procs_per_node; i++)
      nodelist[i] = _my_node_id*_number_of_procs_per_node+i;
    comex_group_create(_number_of_procs_per_node, nodelist,
        COMEX_GROUP_WORLD, &ARMCI_Node_group);
    free(nodelist);
  }
}